

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O0

void fl_initialize(int *argc,char **argv,char *param_3,void *param_4,int param_5)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  int local_34;
  int local_30;
  int j;
  int i;
  int param_4_local;
  void *param_3_local;
  char *param_2_local;
  char **argv_local;
  int *argc_local;
  
  initargc = *argc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(*argc + 1);
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  j = param_5;
  _i = param_4;
  param_3_local = param_3;
  param_2_local = (char *)argv;
  argv_local = (char **)argc;
  initargv = (char **)operator_new__(uVar4);
  for (local_30 = 0; local_30 <= *(int *)argv_local; local_30 = local_30 + 1) {
    initargv[local_30] = *(char **)(param_2_local + (long)local_30 * 8);
  }
  local_34 = 1;
  local_30 = 1;
  while (local_30 < *(int *)argv_local) {
    iVar3 = Fl::arg(*(int *)argv_local,(char **)param_2_local,&local_30);
    if (iVar3 == 0) {
      *(undefined8 *)(param_2_local + (long)local_34 * 8) =
           *(undefined8 *)(param_2_local + (long)local_30 * 8);
      local_34 = local_34 + 1;
      local_30 = local_30 + 1;
    }
  }
  pcVar1 = param_2_local + (long)local_34 * 8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(int *)argv_local = local_34;
  if (fl_flip == '\x02') {
    fl_flip = '\0';
  }
  return;
}

Assistant:

void fl_initialize(int *argc, char **argv, const char *, FL_CMD_OPT *, int) {
  initargc = *argc;
  initargv = new char*[*argc+1];
  int i,j;
  for (i=0; i<=*argc; i++) initargv[i] = argv[i];
  for (i=j=1; i<*argc; ) {
    if (Fl::arg(*argc,argv,i));
    else argv[j++] = argv[i++];
  }
  argv[j] = 0;
  *argc = j;
  if (fl_flip==2) fl_flip = 0;
}